

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quarticSolver.cpp
# Opt level: O0

uint cubicSolver(double *ce,double *roots)

{
  ostream *poVar1;
  void *pvVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  complex<double> *local_288;
  double local_280;
  double local_278;
  double local_270;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [24];
  double local_210;
  double local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [24];
  double local_1a8;
  undefined1 local_1a0 [8];
  complex<double> w;
  complex<double> local_188;
  complex<double> local_178;
  complex<double> local_168 [2];
  double local_148;
  double local_140;
  double local_138;
  complex<double> local_130;
  complex<double> local_120;
  complex<double> local_110;
  complex<double> local_100;
  double local_f0;
  complex<double> local_e8;
  complex<double> local_d8 [2];
  undefined1 local_b8 [8];
  complex<double> rt [3];
  complex<double> u;
  double v;
  double u_1;
  double u3 [2];
  double ce2 [2];
  double discriminant;
  double q;
  double p;
  double shift;
  double *pdStack_20;
  uint ret;
  double *roots_local;
  double *ce_local;
  
  shift._4_4_ = 0;
  p = *ce * 0.3333333333333333;
  q = -p * *ce + ce[1];
  dVar3 = *ce * (*ce * 0.07407407407407407 * *ce + -(ce[1] * 0.3333333333333333)) + ce[2];
  pdStack_20 = roots;
  roots_local = ce;
  poVar1 = std::operator<<((ostream *)&std::cout,"cubicSolver:: p=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,q);
  poVar1 = std::operator<<(poVar1,"\tq=");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,dVar3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  dVar4 = q * 0.037037037037037035 * q * q + dVar3 * 0.25 * dVar3;
  if (1e-75 <= ABS(q)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"cubicSolver:: discriminant=");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,dVar4);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    if (dVar4 <= 0.0) {
      shift._4_4_ = 3;
      std::complex<double>::complex((complex<double> *)(rt[2]._M_value + 8),dVar3,0.0);
      local_288 = (complex<double> *)local_b8;
      do {
        uVar5 = 0;
        std::complex<double>::complex(local_288,0.0,0.0);
        local_288 = local_288 + 1;
      } while (local_288 != (complex<double> *)(rt[2]._M_value + 8));
      local_f0 = -0.5;
      std::operator*(&local_f0,(complex<double> *)(rt[2]._M_value + 8));
      local_138 = 0.25;
      local_e8._M_value._8_8_ = uVar5;
      std::operator*(&local_138,(complex<double> *)(rt[2]._M_value + 8));
      local_130._M_value._8_8_ = uVar5;
      std::operator*(&local_130,(complex<double> *)(rt[2]._M_value + 8));
      uVar6 = 0x403b000000000000;
      local_140 = (q * q * q) / 27.0;
      local_120._M_value._8_8_ = uVar5;
      std::operator+(&local_120,&local_140);
      local_110._M_value._8_8_ = uVar6;
      std::sqrt<double>(&local_110);
      local_100._M_value._8_8_ = uVar6;
      std::operator-(&local_e8,&local_100);
      local_148 = 0.3333333333333333;
      local_d8[0]._M_value._8_8_ = uVar6;
      std::pow<double>(local_d8,&local_148);
      w._M_value._8_8_ = 0x4008000000000000;
      local_d8[1]._M_value._8_8_ = uVar6;
      std::operator*((double *)(w._M_value + 8),(complex<double> *)(rt[2]._M_value + 8));
      local_188._M_value._8_8_ = uVar6;
      std::operator/(&q,&local_188);
      local_178._M_value._8_8_ = uVar6;
      std::operator-((complex<double> *)(rt[2]._M_value + 8),&local_178);
      local_168[0]._M_value._8_8_ = uVar6;
      std::operator-(local_168,&p);
      local_168[1]._M_value._8_8_ = uVar6;
      rt[0]._M_value._0_8_ = uVar6;
      dVar3 = sqrt(3.0);
      dVar3 = dVar3 / 2.0;
      std::complex<double>::complex((complex<double> *)local_1a0,-0.5,dVar3);
      std::operator*((complex<double> *)(rt[2]._M_value + 8),(complex<double> *)local_1a0);
      local_208 = 3.0;
      local_1d0._8_8_ = dVar3;
      std::operator*(&local_208,(complex<double> *)(rt[2]._M_value + 8));
      local_200._8_8_ = dVar3;
      std::operator*((complex<double> *)local_200,(complex<double> *)local_1a0);
      local_1f0._8_8_ = dVar3;
      std::operator/(&q,(complex<double> *)local_1f0);
      local_1e0._8_8_ = dVar3;
      std::operator-((complex<double> *)local_1d0,(complex<double> *)local_1e0);
      local_1c0._8_8_ = dVar3;
      std::operator-((complex<double> *)local_1c0,&p);
      local_1a8 = dVar3;
      rt[1]._M_value._0_8_ = dVar3;
      std::operator/((complex<double> *)(rt[2]._M_value + 8),(complex<double> *)local_1a0);
      local_238._8_8_ = dVar3;
      std::operator*(&q,(complex<double> *)local_1a0);
      local_270 = 3.0;
      local_258._8_8_ = dVar3;
      std::operator*(&local_270,(complex<double> *)(rt[2]._M_value + 8));
      local_268._8_8_ = dVar3;
      std::operator/((complex<double> *)local_258,(complex<double> *)local_268);
      local_248._8_8_ = dVar3;
      std::operator-((complex<double> *)local_238,(complex<double> *)local_248);
      local_228._8_8_ = dVar3;
      std::operator-((complex<double> *)local_228,&p);
      local_210 = dVar3;
      rt[2]._M_value._0_8_ = dVar3;
      dVar3 = std::complex<double>::real_abi_cxx11_((complex<double> *)local_b8);
      *pdStack_20 = dVar3;
      dVar3 = std::complex<double>::real_abi_cxx11_((complex<double> *)(rt[0]._M_value + 8));
      pdStack_20[1] = dVar3;
      dVar3 = std::complex<double>::real_abi_cxx11_((complex<double> *)(rt[1]._M_value + 8));
      pdStack_20[2] = dVar3;
      ce_local._4_4_ = shift._4_4_;
    }
    else {
      u3[1] = dVar3;
      shift._4_4_ = quadraticSolver(u3 + 1,&u_1);
      if (shift._4_4_ == 0) {
        poVar1 = std::operator<<((ostream *)&std::cerr,"cubicSolver::Error cubicSolver(");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,*roots_local);
        poVar1 = std::operator<<(poVar1,' ');
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,roots_local[1]);
        poVar1 = std::operator<<(poVar1,' ');
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,roots_local[2]);
        std::operator<<(poVar1,")\n");
      }
      shift._4_4_ = 1;
      if (0.0 < dVar3) {
        local_280 = pow(-u3[0],0.3333333333333333);
        local_280 = -local_280;
      }
      else {
        local_280 = pow(u_1,0.3333333333333333);
      }
      dVar3 = (q * -0.3333333333333333) / local_280;
      poVar1 = std::operator<<((ostream *)&std::cout,"cubicSolver:: u=");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_280);
      poVar1 = std::operator<<(poVar1,"\tv=");
      pvVar2 = (void *)std::ostream::operator<<(poVar1,dVar3);
      std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,"cubicSolver:: u^3=");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_280 * local_280 * local_280);
      poVar1 = std::operator<<(poVar1,"\tv^3=");
      pvVar2 = (void *)std::ostream::operator<<(poVar1,dVar3 * dVar3 * dVar3);
      std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
      *pdStack_20 = (local_280 + dVar3) - p;
      ce_local._4_4_ = shift._4_4_;
    }
  }
  else {
    shift._4_4_ = 1;
    if (dVar3 <= 0.0) {
      local_278 = pow(-dVar3,0.3333333333333333);
    }
    else {
      local_278 = pow(dVar3,0.3333333333333333);
      local_278 = -local_278;
    }
    *pdStack_20 = local_278;
    *pdStack_20 = *pdStack_20 - p;
    ce_local._4_4_ = shift._4_4_;
  }
  return ce_local._4_4_;
}

Assistant:

unsigned int cubicSolver(double * ce, double *roots)
//cubic equation solver
// x^3 + ce[0] x^2 + ce[1] x + ce[2] = 0
{
    // depressed cubic, Tschirnhaus transformation, x= t - b/(3a)
    // t^3 + p t +q =0
    unsigned int ret=0;
    double shift=(1./3)*ce[0];
    double p=ce[1] -shift*ce[0];
    double q=ce[0]*( (2./27)*ce[0]*ce[0]-(1./3)*ce[1])+ce[2];
    //Cardano's method,
    //	t=u+v
    //	u^3 + v^3 + ( 3 uv + p ) (u+v) + q =0
    //	select 3uv + p =0, then,
    //	u^3 + v^3 = -q
    //	u^3 v^3 = - p^3/27
    //	so, u^3 and v^3 are roots of equation,
    //	z^2 + q z - p^3/27 = 0
    //	and u^3,v^3 are,
    //		-q/2 \pm sqrt(q^2/4 + p^3/27)
    //	discriminant= q^2/4 + p^3/27
    std::cout<<"cubicSolver:: p="<<p<<"\tq="<<q<<std::endl;
    double discriminant= (1./27)*p*p*p+(1./4)*q*q;
    if ( fabs(p)< 1.0e-75) {
        ret=1;
        *roots=(q>0)?-pow(q,(1./3)):pow(-q,(1./3));
        *roots -= shift;
        return ret;
    }
    std::cout<<"cubicSolver:: discriminant="<<discriminant<<std::endl;
    if(discriminant>0) {
        double ce2[2]= {q, -1./27*p*p*p},u3[2];
        ret=quadraticSolver(ce2,u3);
        if (! ret ) { //should not happen
            std::cerr<<"cubicSolver::Error cubicSolver("<<ce[0]<<' '<<ce[1]<<' '<<ce[2]<<")\n";
        }
        ret=1;
        double u,v;
        u= (q<=0) ? pow(u3[0], 1./3): -pow(-u3[1],1./3);
        //u=(q<=0)?pow(-0.5*q+sqrt(discriminant),1./3):-pow(0.5*q+sqrt(discriminant),1./3);
        v=(-1./3)*p/u;
        std::cout<<"cubicSolver:: u="<<u<<"\tv="<<v<<std::endl;
        std::cout<<"cubicSolver:: u^3="<<u*u*u<<"\tv^3="<<v*v*v<<std::endl;
        *roots=u+v - shift;
        return ret;
    }
    ret=3;
    std::complex<double> u(q,0),rt[3];
    u=pow(-0.5*u-sqrt(0.25*u*u+p*p*p/27),1./3);
    rt[0]=u-p/(3.*u)-shift;
    std::complex<double> w(-0.5,sqrt(3.)/2);
    rt[1]=u*w-p/(3.*u*w)-shift;
    rt[2]=u/w-p*w/(3.*u)-shift;
//	std::cout<<"Roots:\n";
//	std::cout<<rt[0]<<std::endl;
//	std::cout<<rt[1]<<std::endl;
//	std::cout<<rt[2]<<std::endl;

    roots[0]=rt[0].real();
    roots[1]=rt[1].real();
    roots[2]=rt[2].real();
    return ret;
}